

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QString>>::
     call<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>
               (QPromise<QString> *promise,QPromiseResolve<QString> *resolve,
               QPromiseReject<void> *reject)

{
  QSharedData *pQVar1;
  bool bVar2;
  anon_class_24_2_d74e9aa7 local_58;
  Data *local_40;
  undefined **local_38;
  PromiseData<QString> *local_30;
  QPromiseBase<QString> local_28;
  
  bVar2 = QtPromise::QPromiseBase<QString>::isFulfilled(&promise->super_QPromiseBase<QString>);
  if (bVar2) {
    PromiseResolver<QString>::resolve<QtPromisePrivate::PromiseValue<QString>const&>
              (&resolve->m_resolver,&((promise->super_QPromiseBase<QString>).m_d.d)->m_value);
    return;
  }
  bVar2 = QtPromise::QPromiseBase<QString>::isRejected(&promise->super_QPromiseBase<QString>);
  if (bVar2) {
    PromiseResolver<QString>::reject<QtPromisePrivate::PromiseError_const&>
              ((PromiseResolver<QString> *)reject,
               &(((promise->super_QPromiseBase<QString>).m_d.d)->
                super_PromiseDataBase<QString,_void_(const_QString_&)>).m_error);
    return;
  }
  local_58.reject.m_resolver.m_d.d = (PromiseResolver<void>)(resolve->m_resolver).m_d.d;
  if (local_58.reject.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)0x0) {
    LOCK();
    (((Data *)local_58.reject.m_resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((Data *)local_58.reject.m_resolver.m_d.d)->super_QSharedData).ref.
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_58.promise.super_QPromiseBase<QString>.m_d.d = (promise->super_QPromiseBase<QString>).m_d.d;
  if (local_58.promise.super_QPromiseBase<QString>.m_d.d != (PromiseData<QString> *)0x0) {
    LOCK();
    pQVar1 = &((local_58.promise.super_QPromiseBase<QString>.m_d.d)->
              super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58.promise.super_QPromiseBase<QString>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_00127930;
  local_40 = (reject->m_resolver).m_d.d;
  if (local_40 != (Data *)0x0) {
    LOCK();
    (local_40->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(local_40->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_30 = (promise->super_QPromiseBase<QString>).m_d.d;
  if (local_30 != (PromiseData<QString> *)0x0) {
    LOCK();
    pQVar1 = &(local_30->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38 = &PTR__QPromiseBase_00127930;
  QtPromise::QPromiseBase<QString>::
  then<QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QString>>::call<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>(QtPromise::QPromise<QString>const&,QtPromise::QPromiseResolve<QString>const&,QtPromise::QPromiseReject<QString>const&)::_lambda()_1_,QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QString>>::call<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>(QtPromise::QPromise<QString>const&,QtPromise::QPromiseResolve<QString>const&,QtPromise::QPromiseReject<QString>const&)::_lambda()_2_>
            (&local_28,(anon_class_24_2_e6a34898 *)promise,&local_58);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_28);
  call<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>(QtPromise::QPromise<QString>const&,QtPromise::QPromiseResolve<QString>const&,QtPromise::QPromiseReject<QString>const&)
  ::{lambda()#2}::~call((_lambda___2_ *)&local_40);
  call<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>(QtPromise::QPromise<QString>const&,QtPromise::QPromiseResolve<QString>const&,QtPromise::QPromiseReject<QString>const&)
  ::{lambda()#1}::~call((_lambda___1_ *)&local_58);
  return;
}

Assistant:

static void
    call(const QtPromise::QPromise<T>& promise, const TResolve& resolve, const TReject& reject)
    {
        if (promise.isFulfilled()) {
            resolve(promise.m_d->value());
        } else if (promise.isRejected()) {
            reject(promise.m_d->error());
        } else {
            promise.then(
                [=]() {
                    resolve(promise.m_d->value());
                },
                [=]() { // catch all
                    reject(promise.m_d->error());
                });
        }
    }